

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

void __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
parse(Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this,char_type t_char,int line,int col,string *filename)

{
  int iVar1;
  eval_error *this_00;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  allocator<char> local_59;
  File_Position local_58;
  string local_50;
  
  bVar4 = (byte)(t_char - 0x30U) < 10;
  bVar5 = (byte)(t_char + 0x9fU) < 6;
  bVar6 = (byte)(t_char + 0xbfU) < 6;
  if (this->is_octal == true) {
    if ((t_char & 0xf8U) == 0x30) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&this->octal_matches,t_char);
      if ((this->octal_matches)._M_string_length != 3) {
        return;
      }
      process_octal(this);
      return;
    }
    process_octal(this);
  }
  else if (this->is_hex == true) {
    if ((bVar5 || bVar4) || bVar6) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&this->hex_matches,t_char);
      if ((this->hex_matches)._M_string_length != 2) {
        return;
      }
      process_hex(this);
      return;
    }
    process_hex(this);
  }
  else if (this->unicode_size != 0) {
    if ((bVar5 || bVar4) || bVar6) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&this->hex_matches,t_char);
      if ((this->hex_matches)._M_string_length != this->unicode_size) {
        return;
      }
      process_unicode(this);
      return;
    }
    process_unicode(this);
  }
  if (t_char == '\\') {
    if (this->is_escaped == false) {
      this->is_escaped = true;
      return;
    }
    pbVar3 = this->match;
    t_char = '\\';
    goto LAB_003a6ca6;
  }
  if (this->is_escaped == false) {
    if ((t_char == '$') && (this->interpolation_allowed != false)) {
      this->saw_interpolation_marker = true;
      return;
    }
    pbVar3 = this->match;
LAB_003a6c0c:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (pbVar3,t_char);
    return;
  }
  if ((t_char & 0xf8U) == 0x30) {
    this->is_octal = true;
    pbVar3 = &this->octal_matches;
    goto LAB_003a6c0c;
  }
  iVar1 = (int)t_char;
  uVar2 = (ulong)(iVar1 - 0x22U);
  if (iVar1 - 0x22U < 0x40) {
    if ((0x20000025UL >> (uVar2 & 0x3f) & 1) == 0) {
      if (uVar2 == 0x33) {
        this->unicode_size = 8;
        return;
      }
      if (uVar2 != 0x3f) goto code_r0x003a6c33;
      t_char = '\a';
    }
  }
  else {
code_r0x003a6c33:
    switch(iVar1) {
    case 0x6e:
      t_char = '\n';
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x77:
switchD_003a6c41_caseD_6f:
      this_00 = (eval_error *)__cxa_allocate_exception(0x90);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Unknown escaped sequence in string",&local_59);
      local_58.line = line;
      local_58.column = col;
      exception::eval_error::eval_error(this_00,&local_50,&local_58,filename);
      __cxa_throw(this_00,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    case 0x72:
      t_char = '\r';
      break;
    case 0x74:
      t_char = '\t';
      break;
    case 0x75:
      this->unicode_size = 4;
      return;
    case 0x76:
      t_char = '\v';
      break;
    case 0x78:
      this->is_hex = true;
      return;
    default:
      if (iVar1 == 0x62) {
        t_char = '\b';
      }
      else {
        if (iVar1 != 0x66) goto switchD_003a6c41_caseD_6f;
        t_char = '\f';
      }
    }
  }
  pbVar3 = this->match;
LAB_003a6ca6:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (pbVar3,t_char);
  this->is_escaped = false;
  return;
}

Assistant:

void parse(const char_type t_char, const int line, const int col, const std::string &filename) {
          const bool is_octal_char = t_char >= '0' && t_char <= '7';

          const bool is_hex_char = (t_char >= '0' && t_char <= '9') || (t_char >= 'a' && t_char <= 'f') || (t_char >= 'A' && t_char <= 'F');

          if (is_octal) {
            if (is_octal_char) {
              octal_matches.push_back(t_char);

              if (octal_matches.size() == 3) {
                process_octal();
              }
              return;
            } else {
              process_octal();
            }
          } else if (is_hex) {
            if (is_hex_char) {
              hex_matches.push_back(t_char);

              if (hex_matches.size() == 2 * sizeof(char_type)) {
                // This rule differs from the C/C++ standard, but ChaiScript
                // does not offer the same workaround options, and having
                // hexadecimal sequences longer than can fit into the char
                // type is undefined behavior anyway.
                process_hex();
              }
              return;
            } else {
              process_hex();
            }
          } else if (unicode_size > 0) {
            if (is_hex_char) {
              hex_matches.push_back(t_char);

              if (hex_matches.size() == unicode_size) {
                // Format is specified to be 'slash'uABCD
                // on collecting from A to D do parsing
                process_unicode();
              }
              return;
            } else {
              // Not a unicode anymore, try parsing any way
              // May be someone used 'slash'uAA only
              process_unicode();
            }
          }

          if (t_char == '\\') {
            if (is_escaped) {
              match.push_back('\\');
              is_escaped = false;
            } else {
              is_escaped = true;
            }
          } else {
            if (is_escaped) {
              if (is_octal_char) {
                is_octal = true;
                octal_matches.push_back(t_char);
              } else if (t_char == 'x') {
                is_hex = true;
              } else if (t_char == 'u') {
                unicode_size = 4;
              } else if (t_char == 'U') {
                unicode_size = 8;
              } else {
                switch (t_char) {
                  case ('\''):
                    match.push_back('\'');
                    break;
                  case ('\"'):
                    match.push_back('\"');
                    break;
                  case ('?'):
                    match.push_back('?');
                    break;
                  case ('a'):
                    match.push_back('\a');
                    break;
                  case ('b'):
                    match.push_back('\b');
                    break;
                  case ('f'):
                    match.push_back('\f');
                    break;
                  case ('n'):
                    match.push_back('\n');
                    break;
                  case ('r'):
                    match.push_back('\r');
                    break;
                  case ('t'):
                    match.push_back('\t');
                    break;
                  case ('v'):
                    match.push_back('\v');
                    break;
                  case ('$'):
                    match.push_back('$');
                    break;
                  default:
                    throw exception::eval_error("Unknown escaped sequence in string", File_Position(line, col), filename);
                }
                is_escaped = false;
              }
            } else if (interpolation_allowed && t_char == '$') {
              saw_interpolation_marker = true;
            } else {
              match.push_back(t_char);
            }
          }
        }